

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBlock * AnalyzeBlock(ExpressionContext *ctx,SynBlock *syntax,bool createScope)

{
  TypeBase *type;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<ExprBase> expressions_01;
  ExprBase *pEVar1;
  SynBase *source;
  FunctionData *onwerFunction;
  SynBase *local_70;
  SynBase *expression_1;
  IntrusiveList<ExprBase> expressions;
  ExprBlock *block;
  SynBase *expression;
  IntrusiveList<ExprBase> expressions_1;
  bool createScope_local;
  SynBlock *syntax_local;
  ExpressionContext *ctx_local;
  
  expressions_1.tail._7_1_ = createScope;
  if (createScope) {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expression);
    for (block = (ExprBlock *)(syntax->expressions).head; block != (ExprBlock *)0x0;
        block = (ExprBlock *)(block->expressions).head) {
      pEVar1 = AnalyzeStatement(ctx,(SynBase *)block);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expression,pEVar1);
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprBlock>(ctx);
    type = ctx->typeVoid;
    expressions.tail = (ExprBase *)expression;
    source = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    onwerFunction = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    pEVar1 = CreateBlockUpvalueClose(ctx,source,onwerFunction,ctx->scope);
    expressions_01.tail = expressions_1.head;
    expressions_01.head = expressions.tail;
    ExprBlock::ExprBlock((ExprBlock *)ctx_local,&syntax->super_SynBase,type,expressions_01,pEVar1);
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT);
  }
  else {
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&expression_1);
    for (local_70 = (syntax->expressions).head; local_70 != (SynBase *)0x0;
        local_70 = local_70->next) {
      pEVar1 = AnalyzeStatement(ctx,local_70);
      IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&expression_1,pEVar1);
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprBlock>(ctx);
    expressions_00.tail = expressions.head;
    expressions_00.head = (ExprBase *)expression_1;
    ExprBlock::ExprBlock
              ((ExprBlock *)ctx_local,&syntax->super_SynBase,ctx->typeVoid,expressions_00,
               (ExprBase *)0x0);
  }
  return (ExprBlock *)ctx_local;
}

Assistant:

ExprBlock* AnalyzeBlock(ExpressionContext &ctx, SynBlock *syntax, bool createScope)
{
	if(createScope)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);

		return block;
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	return new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);
}